

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

prog_chunk * __thiscall
mvm::assembler<mvm::test::test_instr_set_extra,_mvm::bytecode_serializer>::assemble
          (prog_chunk *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set_extra,_mvm::bytecode_serializer> *this,istream *stream
          )

{
  bool bVar1;
  istream *piVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  const_iterator local_78;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> line_assembly;
  undefined1 local_48 [8];
  string line;
  istream *stream_local;
  assembler<mvm::test::test_instr_set_extra,_mvm::bytecode_serializer> *this_local;
  prog_chunk *c;
  
  line.field_2._M_local_buf[0xf] = '\0';
  prog_chunk::prog_chunk(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)local_48);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    assemble((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,this,
             (string *)local_48);
    local_80._M_current =
         (uchar *)std::end<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&__return_storage_ptr__->code);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_78,&local_80);
    __first = std::cbegin<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    __last = std::cend<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               local_78,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )__first._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    prog_chunk::~prog_chunk(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

prog_chunk assembler<Set, MetaCodeImpl>::assemble(std::istream &stream) const {
  prog_chunk c;
  std::string line;
  while (std::getline(stream, line)) {
    auto line_assembly = assemble(line);
    c.code.insert(std::end(c.code), std::cbegin(line_assembly),
                  std::cend(line_assembly));
  }

  return c;
}